

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O0

expected<void,_std::error_code> * __thiscall
jaegertracing::Tracer::Inject
          (expected<void,_std::error_code> *__return_storage_ptr__,Tracer *this,SpanContext *ctx,
          HTTPHeadersWriter *writer)

{
  element_type *peVar1;
  HTTPHeadersWriter *pHVar2;
  error_code e;
  long local_98;
  expected<void,_std::error_code> local_70;
  ulong local_58;
  undefined8 local_50;
  expected<void,_std::error_code> local_48;
  long local_30;
  SpanContext *jaegerCtx;
  HTTPHeadersWriter *writer_local;
  SpanContext *ctx_local;
  Tracer *this_local;
  
  jaegerCtx = (SpanContext *)writer;
  writer_local = (HTTPHeadersWriter *)ctx;
  ctx_local = (SpanContext *)this;
  this_local = (Tracer *)__return_storage_ptr__;
  if (ctx == (SpanContext *)0x0) {
    local_98 = 0;
  }
  else {
    pHVar2 = (HTTPHeadersWriter *)0x0;
    local_98 = __dynamic_cast(ctx,&opentracing::v3::SpanContext::typeinfo,&SpanContext::typeinfo);
    writer = pHVar2;
  }
  local_30 = local_98;
  if (local_98 == 0) {
    local_58 = opentracing::v3::invalid_span_context_error;
    local_50 = DAT_005330f0;
    e._M_cat = (error_category *)writer;
    e._0_8_ = DAT_005330f0;
    opentracing::v3::make_expected_from_error<void,std::error_code>
              (&local_48,(v3 *)(opentracing::v3::invalid_span_context_error & 0xffffffff),e);
    opentracing::v3::expected<void,_std::error_code>::expected<true,_0>
              (__return_storage_ptr__,&local_48);
    opentracing::v3::expected<void,_std::error_code>::~expected(&local_48);
  }
  else {
    peVar1 = std::
             __shared_ptr_access<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_httpHeaderPropagator);
    (*(peVar1->super_Extractor<const_opentracing::v3::HTTPHeadersReader_&>)._vptr_Extractor[3])
              (peVar1,local_30,jaegerCtx);
    opentracing::v3::make_expected();
    opentracing::v3::expected<void,_std::error_code>::expected<true,_0>
              (__return_storage_ptr__,&local_70);
    opentracing::v3::expected<void,_std::error_code>::~expected(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

opentracing::expected<void>
    Inject(const opentracing::SpanContext& ctx,
           const opentracing::HTTPHeadersWriter& writer) const override
    {
        const auto* jaegerCtx = dynamic_cast<const SpanContext*>(&ctx);
        if (!jaegerCtx) {
            return opentracing::make_expected_from_error<void>(
                opentracing::invalid_span_context_error);
        }
        _httpHeaderPropagator->inject(*jaegerCtx, writer);
        return opentracing::make_expected();
    }